

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.h
# Opt level: O2

void __thiscall CP::list<int>::replace(list<int> *this,int *x,list<int> *y)

{
  node *pnVar1;
  iterator it;
  node *pnVar2;
  list<int> *__range4;
  int val;
  int local_3c;
  int *local_38;
  
  pnVar1 = this->mHeader;
  it.ptr = pnVar1->next;
  do {
    while( true ) {
      if (pnVar1 == it.ptr) {
        return;
      }
      if ((it.ptr)->data == *x) break;
      it.ptr = (it.ptr)->next;
    }
    local_38 = x;
    it = erase(this,it);
    pnVar1 = y->mHeader;
    pnVar2 = pnVar1;
    while (pnVar2 = pnVar2->next, pnVar1 != pnVar2) {
      local_3c = pnVar2->data;
      insert(this,it,&local_3c);
    }
    pnVar1 = this->mHeader;
    x = local_38;
  } while( true );
}

Assistant:

void replace(const T &x, list<T> &y) {
    auto it = begin();
    while (it != end()) {
        if (*it == x) {
            it = erase(it);
            for (auto val : y) {
                insert(it, val);
            }
        } else {
            ++it;
        }
    }
}